

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_suite.cpp
# Opt level: O3

void __thiscall reader_url_suite::test_path_abempty_two::test_method(test_path_abempty_two *this)

{
  bool bVar1;
  uint uVar2;
  undefined4 uVar3;
  uint local_380;
  undefined1 local_37c [12];
  view_type *local_370;
  view_type local_368;
  undefined8 *local_358;
  view_type **local_350;
  undefined **local_348;
  undefined1 local_340;
  undefined8 *local_338;
  undefined1 *local_330;
  undefined **local_328;
  undefined1 local_320;
  undefined8 *local_318;
  char *local_310;
  undefined1 local_308 [8];
  undefined8 local_300;
  shared_count sStack_2f8;
  char *local_2f0;
  char *local_2e8;
  url reader;
  char *local_248;
  char *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  char *local_228;
  char *local_220;
  undefined1 *local_218;
  undefined1 *local_210;
  char *local_208;
  char *local_200;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  char *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  char *local_1a8;
  char *local_1a0;
  undefined1 *local_198;
  undefined1 *local_190;
  char *local_188;
  char *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  char *local_168;
  char *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  char *local_148;
  char *local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  char *local_128;
  char *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  char *local_108;
  char *local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  char *local_e8;
  char *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  char *local_c8;
  char *local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  char *local_a8;
  char *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  char *local_88;
  char *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  char *local_68;
  char *local_60;
  char input [30];
  
  local_368.ptr_ = input;
  builtin_strncpy(input + 0x10,".com/path/two",0xe);
  builtin_strncpy(input,"scheme://example",0x10);
  local_368.len_ = strlen(local_368.ptr_);
  trial::url::reader::basic_url<char>::basic_url(&reader,&local_368);
  local_68 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_60 = "";
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_68,0x8a);
  local_320 = 0;
  local_328 = &PTR__lazy_ostream_00186288;
  local_318 = &boost::unit_test::lazy_ostream::inst;
  local_310 = "";
  local_370 = (view_type *)local_37c;
  local_37c._0_4_ = reader.super_base<char,_trial::url::reader::basic_url>.current_token;
  local_37c._4_8_ = &local_380;
  local_308[0] = reader.super_base<char,_trial::url::reader::basic_url>.current_token == scheme;
  local_380 = 2;
  local_300 = 0;
  sStack_2f8.pi_ = (sp_counted_base *)0x0;
  local_2f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_2e8 = "";
  local_350 = &local_370;
  local_368.len_ = local_368.len_ & 0xffffffffffffff00;
  local_368.ptr_ = (char *)&PTR__lazy_ostream_00186618;
  local_358 = &boost::unit_test::lazy_ostream::inst;
  local_340 = 0;
  local_330 = local_37c + 4;
  local_348 = &PTR__lazy_ostream_00186618;
  local_338 = &boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2f8);
  local_88 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_80 = "";
  local_98 = &boost::unit_test::basic_cstring<char_const>::null;
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_88,0x8b);
  local_320 = 0;
  local_328 = &PTR__lazy_ostream_00186288;
  local_318 = &boost::unit_test::lazy_ostream::inst;
  local_310 = "";
  if (reader.super_base<char,_trial::url::reader::basic_url>.current_view.len_ == 6) {
    local_308[0] = *(short *)(reader.super_base<char,_trial::url::reader::basic_url>.current_view.
                              ptr_ + 4) == 0x656d &&
                   *(int *)reader.super_base<char,_trial::url::reader::basic_url>.current_view.ptr_
                   == 0x65686373;
  }
  else {
    local_308[0] = false;
  }
  local_300 = 0;
  sStack_2f8.pi_ = (sp_counted_base *)0x0;
  local_2f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_2e8 = "";
  local_370 = &reader.super_base<char,_trial::url::reader::basic_url>.current_view;
  local_368.len_ = local_368.len_ & 0xffffffffffffff00;
  local_368.ptr_ = (char *)&PTR__lazy_ostream_00186598;
  local_358 = &boost::unit_test::lazy_ostream::inst;
  local_350 = &local_370;
  local_37c._4_8_ = "scheme";
  local_340 = 0;
  local_348 = &PTR__lazy_ostream_00186358;
  local_338 = &boost::unit_test::lazy_ostream::inst;
  local_330 = local_37c + 4;
  boost::test_tools::tt_detail::report_assertion
            (local_308,&local_328,&local_2f0,0x8b,2,2,2,"reader.literal()",&local_368,"\"scheme\"",
             &local_348);
  boost::detail::shared_count::~shared_count(&sStack_2f8);
  local_a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_a0 = "";
  local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a8,0x8c);
  local_320 = 0;
  local_328 = &PTR__lazy_ostream_00186288;
  local_318 = &boost::unit_test::lazy_ostream::inst;
  local_310 = "";
  local_308[0] = trial::url::reader::basic_url<char>::do_next(&reader);
  local_37c[0] = local_308[0];
  local_380 = CONCAT31(local_380._1_3_,1);
  local_300 = 0;
  sStack_2f8.pi_ = (sp_counted_base *)0x0;
  local_2f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_2e8 = "";
  local_370 = (view_type *)local_37c;
  local_368.len_ = local_368.len_ & 0xffffffffffffff00;
  local_368.ptr_ = (char *)&PTR__lazy_ostream_001865d8;
  local_358 = &boost::unit_test::lazy_ostream::inst;
  local_350 = &local_370;
  local_37c._4_8_ = &local_380;
  local_340 = 0;
  local_348 = &PTR__lazy_ostream_001865d8;
  local_338 = &boost::unit_test::lazy_ostream::inst;
  local_330 = local_37c + 4;
  boost::test_tools::tt_detail::report_assertion
            (local_308,&local_328,&local_2f0,0x8c,2,2,2,"reader.next()",&local_368,"true",&local_348
            );
  boost::detail::shared_count::~shared_count(&sStack_2f8);
  local_c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_c0 = "";
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c8,0x8d);
  local_320 = 0;
  local_328 = &PTR__lazy_ostream_00186288;
  local_318 = &boost::unit_test::lazy_ostream::inst;
  local_310 = "";
  local_308[0] = reader.super_base<char,_trial::url::reader::basic_url>.current_token ==
                 authority_host_name;
  local_37c._0_4_ = reader.super_base<char,_trial::url::reader::basic_url>.current_token;
  local_380 = 4;
  local_300 = 0;
  sStack_2f8.pi_ = (sp_counted_base *)0x0;
  local_2f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_2e8 = "";
  local_370 = (view_type *)local_37c;
  local_368.len_ = local_368.len_ & 0xffffffffffffff00;
  local_368.ptr_ = (char *)&PTR__lazy_ostream_00186618;
  local_358 = &boost::unit_test::lazy_ostream::inst;
  local_350 = &local_370;
  local_37c._4_8_ = &local_380;
  local_340 = 0;
  local_348 = &PTR__lazy_ostream_00186618;
  local_338 = &boost::unit_test::lazy_ostream::inst;
  local_330 = local_37c + 4;
  boost::test_tools::tt_detail::report_assertion
            (local_308,&local_328,&local_2f0,0x8d,2,2,2,"reader.subcode()",&local_368,
             "url::token::subcode::authority_host_name",&local_348);
  boost::detail::shared_count::~shared_count(&sStack_2f8);
  local_e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_e0 = "";
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e8,0x8e);
  local_320 = 0;
  local_328 = &PTR__lazy_ostream_00186288;
  local_318 = &boost::unit_test::lazy_ostream::inst;
  local_310 = "";
  if (reader.super_base<char,_trial::url::reader::basic_url>.current_view.len_ == 0xb) {
    local_308[0] = *(long *)(reader.super_base<char,_trial::url::reader::basic_url>.current_view.
                             ptr_ + 3) == 0x6d6f632e656c706d &&
                   *(long *)reader.super_base<char,_trial::url::reader::basic_url>.current_view.ptr_
                   == 0x2e656c706d617865;
  }
  else {
    local_308[0] = false;
  }
  local_300 = 0;
  sStack_2f8.pi_ = (sp_counted_base *)0x0;
  local_2f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_2e8 = "";
  local_370 = &reader.super_base<char,_trial::url::reader::basic_url>.current_view;
  local_368.len_ = local_368.len_ & 0xffffffffffffff00;
  local_368.ptr_ = (char *)&PTR__lazy_ostream_00186598;
  local_358 = &boost::unit_test::lazy_ostream::inst;
  local_350 = &local_370;
  local_37c._4_8_ = "example.com";
  local_340 = 0;
  local_348 = &PTR__lazy_ostream_00186458;
  local_338 = &boost::unit_test::lazy_ostream::inst;
  local_330 = local_37c + 4;
  boost::test_tools::tt_detail::report_assertion
            (local_308,&local_328,&local_2f0,0x8e,2,2,2,"reader.literal()",&local_368,
             "\"example.com\"",&local_348);
  boost::detail::shared_count::~shared_count(&sStack_2f8);
  local_108 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_100 = "";
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_108,0x8f);
  local_320 = 0;
  local_328 = &PTR__lazy_ostream_00186288;
  local_318 = &boost::unit_test::lazy_ostream::inst;
  local_310 = "";
  local_308[0] = trial::url::reader::basic_url<char>::do_next(&reader);
  local_37c[0] = local_308[0];
  local_380 = CONCAT31(local_380._1_3_,1);
  local_300 = 0;
  sStack_2f8.pi_ = (sp_counted_base *)0x0;
  local_2f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_2e8 = "";
  local_370 = (view_type *)local_37c;
  uVar3 = 0;
  local_368.len_ = local_368.len_ & 0xffffffffffffff00;
  local_368.ptr_ = (char *)&PTR__lazy_ostream_001865d8;
  local_358 = &boost::unit_test::lazy_ostream::inst;
  local_37c._4_8_ = &local_380;
  local_340 = 0;
  local_348 = &PTR__lazy_ostream_001865d8;
  local_338 = &boost::unit_test::lazy_ostream::inst;
  local_330 = local_37c + 4;
  local_350 = &local_370;
  boost::test_tools::tt_detail::report_assertion
            (local_308,&local_328,&local_2f0,0x8f,2,2,2,"reader.next()",&local_368,"true",&local_348
            );
  boost::detail::shared_count::~shared_count(&sStack_2f8);
  local_128 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_120 = "";
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_128,0x90);
  local_320 = 0;
  local_328 = &PTR__lazy_ostream_00186288;
  local_318 = &boost::unit_test::lazy_ostream::inst;
  local_310 = "";
  uVar2 = reader.super_base<char,_trial::url::reader::basic_url>.current_token - scheme;
  local_308[0] = 0;
  if (uVar2 < 0xb) {
    local_308[0] = (&DAT_0017063b)[uVar2];
    uVar3 = *(undefined4 *)(&DAT_00170a00 + (ulong)uVar2 * 4);
  }
  local_380 = 3;
  local_300 = 0;
  sStack_2f8.pi_ = (sp_counted_base *)0x0;
  local_2f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_2e8 = "";
  local_370 = (view_type *)local_37c;
  local_368.len_ = local_368.len_ & 0xffffffffffffff00;
  local_368.ptr_ = (char *)&PTR__lazy_ostream_00186518;
  local_358 = &boost::unit_test::lazy_ostream::inst;
  local_340 = 0;
  local_348 = &PTR__lazy_ostream_00186518;
  local_338 = &boost::unit_test::lazy_ostream::inst;
  local_330 = local_37c + 4;
  local_37c._0_4_ = uVar3;
  local_37c._4_8_ = &local_380;
  local_350 = &local_370;
  boost::test_tools::tt_detail::report_assertion
            (local_308,&local_328,&local_2f0,0x90,2,2,2,"reader.category()",&local_368,
             "url::token::category::path",&local_348);
  boost::detail::shared_count::~shared_count(&sStack_2f8);
  local_148 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_140 = "";
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_148,0x91);
  local_320 = 0;
  local_328 = &PTR__lazy_ostream_00186288;
  local_318 = &boost::unit_test::lazy_ostream::inst;
  local_310 = "";
  local_37c._0_4_ =
       trial::url::reader::base<char,_trial::url::reader::basic_url>::code
                 (&reader.super_base<char,_trial::url::reader::basic_url>);
  local_380 = 6;
  local_308[0] = local_37c._0_4_ == path_segment;
  local_300 = 0;
  sStack_2f8.pi_ = (sp_counted_base *)0x0;
  local_2f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_2e8 = "";
  local_368.len_ = local_368.len_ & 0xffffffffffffff00;
  local_368.ptr_ = (char *)&PTR__lazy_ostream_00186558;
  local_358 = &boost::unit_test::lazy_ostream::inst;
  local_340 = 0;
  local_348 = &PTR__lazy_ostream_00186558;
  local_338 = &boost::unit_test::lazy_ostream::inst;
  local_330 = local_37c + 4;
  local_37c._4_8_ = &local_380;
  local_370 = (view_type *)local_37c;
  local_350 = &local_370;
  boost::test_tools::tt_detail::report_assertion
            (local_308,&local_328,&local_2f0,0x91,2,2,2,"reader.code()",&local_368,
             "url::token::code::path_segment",&local_348);
  boost::detail::shared_count::~shared_count(&sStack_2f8);
  local_168 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_160 = "";
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_168,0x92);
  local_320 = 0;
  local_328 = &PTR__lazy_ostream_00186288;
  local_318 = &boost::unit_test::lazy_ostream::inst;
  local_310 = "";
  local_308[0] = reader.super_base<char,_trial::url::reader::basic_url>.current_token ==
                 path_segment;
  local_37c._0_4_ = reader.super_base<char,_trial::url::reader::basic_url>.current_token;
  local_380 = 8;
  local_300 = 0;
  sStack_2f8.pi_ = (sp_counted_base *)0x0;
  local_2f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_2e8 = "";
  local_368.len_ = local_368.len_ & 0xffffffffffffff00;
  local_368.ptr_ = (char *)&PTR__lazy_ostream_00186618;
  local_358 = &boost::unit_test::lazy_ostream::inst;
  local_350 = &local_370;
  local_37c._4_8_ = &local_380;
  local_340 = 0;
  local_348 = &PTR__lazy_ostream_00186618;
  local_338 = &boost::unit_test::lazy_ostream::inst;
  local_370 = (view_type *)local_37c;
  local_330 = local_37c + 4;
  boost::test_tools::tt_detail::report_assertion
            (local_308,&local_328,&local_2f0,0x92,2,2,2,"reader.subcode()",&local_368,
             "url::token::subcode::path_segment",&local_348);
  boost::detail::shared_count::~shared_count(&sStack_2f8);
  local_188 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_180 = "";
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_188,0x93);
  local_320 = 0;
  local_328 = &PTR__lazy_ostream_00186288;
  local_318 = &boost::unit_test::lazy_ostream::inst;
  local_310 = "";
  if (reader.super_base<char,_trial::url::reader::basic_url>.current_view.len_ == 4) {
    local_308[0] = *(int *)reader.super_base<char,_trial::url::reader::basic_url>.current_view.ptr_
                   == 0x68746170;
  }
  else {
    local_308[0] = false;
  }
  local_300 = 0;
  sStack_2f8.pi_ = (sp_counted_base *)0x0;
  local_2f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_2e8 = "";
  local_370 = &reader.super_base<char,_trial::url::reader::basic_url>.current_view;
  local_368.len_ = local_368.len_ & 0xffffffffffffff00;
  local_368.ptr_ = (char *)&PTR__lazy_ostream_00186598;
  local_358 = &boost::unit_test::lazy_ostream::inst;
  local_350 = &local_370;
  local_37c._4_8_ = "path";
  local_340 = 0;
  local_348 = &PTR__lazy_ostream_00186698;
  local_338 = &boost::unit_test::lazy_ostream::inst;
  local_330 = local_37c + 4;
  boost::test_tools::tt_detail::report_assertion
            (local_308,&local_328,&local_2f0,0x93,2,2,2,"reader.literal()",&local_368,"\"path\"",
             &local_348);
  boost::detail::shared_count::~shared_count(&sStack_2f8);
  local_1a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_1a0 = "";
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1a8,0x94);
  local_320 = 0;
  local_328 = &PTR__lazy_ostream_00186288;
  local_318 = &boost::unit_test::lazy_ostream::inst;
  local_310 = "";
  local_308[0] = trial::url::reader::basic_url<char>::do_next(&reader);
  local_37c[0] = local_308[0];
  local_380 = CONCAT31(local_380._1_3_,1);
  local_300 = 0;
  sStack_2f8.pi_ = (sp_counted_base *)0x0;
  local_2f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_2e8 = "";
  uVar3 = 0;
  local_368.len_ = local_368.len_ & 0xffffffffffffff00;
  local_368.ptr_ = (char *)&PTR__lazy_ostream_001865d8;
  local_358 = &boost::unit_test::lazy_ostream::inst;
  local_350 = &local_370;
  local_37c._4_8_ = &local_380;
  local_340 = 0;
  local_348 = &PTR__lazy_ostream_001865d8;
  local_338 = &boost::unit_test::lazy_ostream::inst;
  local_330 = local_37c + 4;
  local_370 = (view_type *)local_37c;
  boost::test_tools::tt_detail::report_assertion
            (local_308,&local_328,&local_2f0,0x94,2,2,2,"reader.next()",&local_368,"true",&local_348
            );
  boost::detail::shared_count::~shared_count(&sStack_2f8);
  local_1c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_1c0 = "";
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1c8,0x95);
  local_320 = 0;
  local_328 = &PTR__lazy_ostream_00186288;
  local_318 = &boost::unit_test::lazy_ostream::inst;
  local_310 = "";
  uVar2 = reader.super_base<char,_trial::url::reader::basic_url>.current_token - scheme;
  local_308[0] = 0;
  if (uVar2 < 0xb) {
    local_308[0] = (&DAT_0017063b)[uVar2];
    uVar3 = *(undefined4 *)(&DAT_00170a00 + (ulong)uVar2 * 4);
  }
  local_380 = 3;
  local_300 = 0;
  sStack_2f8.pi_ = (sp_counted_base *)0x0;
  local_2f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_2e8 = "";
  local_368.len_ = local_368.len_ & 0xffffffffffffff00;
  local_368.ptr_ = (char *)&PTR__lazy_ostream_00186518;
  local_358 = &boost::unit_test::lazy_ostream::inst;
  local_350 = &local_370;
  local_340 = 0;
  local_348 = &PTR__lazy_ostream_00186518;
  local_338 = &boost::unit_test::lazy_ostream::inst;
  local_330 = local_37c + 4;
  local_37c._0_4_ = uVar3;
  local_37c._4_8_ = &local_380;
  local_370 = (view_type *)local_37c;
  boost::test_tools::tt_detail::report_assertion
            (local_308,&local_328,&local_2f0,0x95,2,2,2,"reader.category()",&local_368,
             "url::token::category::path",&local_348);
  boost::detail::shared_count::~shared_count(&sStack_2f8);
  local_1e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_1e0 = "";
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1e8,0x96);
  local_320 = 0;
  local_328 = &PTR__lazy_ostream_00186288;
  local_318 = &boost::unit_test::lazy_ostream::inst;
  local_310 = "";
  local_37c._0_4_ =
       trial::url::reader::base<char,_trial::url::reader::basic_url>::code
                 (&reader.super_base<char,_trial::url::reader::basic_url>);
  local_380 = 6;
  local_308[0] = local_37c._0_4_ == path_segment;
  local_300 = 0;
  sStack_2f8.pi_ = (sp_counted_base *)0x0;
  local_2f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_2e8 = "";
  local_368.len_ = local_368.len_ & 0xffffffffffffff00;
  local_368.ptr_ = (char *)&PTR__lazy_ostream_00186558;
  local_358 = &boost::unit_test::lazy_ostream::inst;
  local_350 = &local_370;
  local_340 = 0;
  local_348 = &PTR__lazy_ostream_00186558;
  local_338 = &boost::unit_test::lazy_ostream::inst;
  local_330 = local_37c + 4;
  local_37c._4_8_ = &local_380;
  local_370 = (view_type *)local_37c;
  boost::test_tools::tt_detail::report_assertion
            (local_308,&local_328,&local_2f0,0x96,2,2,2,"reader.code()",&local_368,
             "url::token::code::path_segment",&local_348);
  boost::detail::shared_count::~shared_count(&sStack_2f8);
  local_208 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_200 = "";
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_208,0x97);
  local_320 = 0;
  local_328 = &PTR__lazy_ostream_00186288;
  local_318 = &boost::unit_test::lazy_ostream::inst;
  local_310 = "";
  local_308[0] = reader.super_base<char,_trial::url::reader::basic_url>.current_token ==
                 path_segment;
  local_37c._0_4_ = reader.super_base<char,_trial::url::reader::basic_url>.current_token;
  local_380 = 8;
  local_300 = 0;
  sStack_2f8.pi_ = (sp_counted_base *)0x0;
  local_2f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_2e8 = "";
  local_368.len_ = local_368.len_ & 0xffffffffffffff00;
  local_368.ptr_ = (char *)&PTR__lazy_ostream_00186618;
  local_358 = &boost::unit_test::lazy_ostream::inst;
  local_350 = &local_370;
  local_37c._4_8_ = &local_380;
  local_340 = 0;
  local_348 = &PTR__lazy_ostream_00186618;
  local_338 = &boost::unit_test::lazy_ostream::inst;
  local_330 = local_37c + 4;
  local_370 = (view_type *)local_37c;
  boost::test_tools::tt_detail::report_assertion
            (local_308,&local_328,&local_2f0,0x97,2,2,2,"reader.subcode()",&local_368,
             "url::token::subcode::path_segment",&local_348);
  boost::detail::shared_count::~shared_count(&sStack_2f8);
  local_228 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_220 = "";
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_228,0x98);
  local_320 = 0;
  local_328 = &PTR__lazy_ostream_00186288;
  local_318 = &boost::unit_test::lazy_ostream::inst;
  local_310 = "";
  if (reader.super_base<char,_trial::url::reader::basic_url>.current_view.len_ == 3) {
    local_308[0] = reader.super_base<char,_trial::url::reader::basic_url>.current_view.ptr_[2] ==
                   'o' && *(short *)reader.super_base<char,_trial::url::reader::basic_url>.
                                    current_view.ptr_ == 0x7774;
  }
  else {
    local_308[0] = false;
  }
  local_300 = 0;
  sStack_2f8.pi_ = (sp_counted_base *)0x0;
  local_2f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_2e8 = "";
  local_370 = &reader.super_base<char,_trial::url::reader::basic_url>.current_view;
  local_368.len_ = local_368.len_ & 0xffffffffffffff00;
  local_368.ptr_ = (char *)&PTR__lazy_ostream_00186598;
  local_358 = &boost::unit_test::lazy_ostream::inst;
  local_350 = &local_370;
  local_37c._4_8_ = "two";
  local_340 = 0;
  local_348 = &PTR__lazy_ostream_001866d8;
  local_338 = &boost::unit_test::lazy_ostream::inst;
  local_330 = local_37c + 4;
  boost::test_tools::tt_detail::report_assertion
            (local_308,&local_328,&local_2f0,0x98,2,2,2,"reader.literal()",&local_368,"\"two\"",
             &local_348);
  boost::detail::shared_count::~shared_count(&sStack_2f8);
  local_248 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_240 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_248,0x99);
  local_320 = 0;
  local_328 = &PTR__lazy_ostream_00186288;
  local_318 = &boost::unit_test::lazy_ostream::inst;
  local_310 = "";
  bVar1 = trial::url::reader::basic_url<char>::do_next(&reader);
  local_37c[0] = bVar1;
  local_380 = local_380 & 0xffffff00;
  local_308[0] = !bVar1;
  local_300 = 0;
  sStack_2f8.pi_ = (sp_counted_base *)0x0;
  local_2f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_2e8 = "";
  local_368.len_ = local_368.len_ & 0xffffffffffffff00;
  local_368.ptr_ = (char *)&PTR__lazy_ostream_001865d8;
  local_358 = &boost::unit_test::lazy_ostream::inst;
  local_350 = &local_370;
  local_37c._4_8_ = &local_380;
  local_340 = 0;
  local_348 = &PTR__lazy_ostream_001865d8;
  local_338 = &boost::unit_test::lazy_ostream::inst;
  local_330 = local_37c + 4;
  local_370 = (view_type *)local_37c;
  boost::test_tools::tt_detail::report_assertion
            (local_308,&local_328,&local_2f0,0x99,2,2,2,"reader.next()",&local_368,"false",
             &local_348);
  boost::detail::shared_count::~shared_count(&sStack_2f8);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_path_abempty_two)
{
    const char input[] = "scheme://example.com/path/two";
    url::reader::url reader(input);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::scheme);
    BOOST_REQUIRE_EQUAL(reader.literal(), "scheme");
    BOOST_REQUIRE_EQUAL(reader.next(), true);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::authority_host_name);
    BOOST_REQUIRE_EQUAL(reader.literal(), "example.com");
    BOOST_REQUIRE_EQUAL(reader.next(), true);
    BOOST_REQUIRE_EQUAL(reader.category(), url::token::category::path);
    BOOST_REQUIRE_EQUAL(reader.code(), url::token::code::path_segment);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::path_segment);
    BOOST_REQUIRE_EQUAL(reader.literal(), "path");
    BOOST_REQUIRE_EQUAL(reader.next(), true);
    BOOST_REQUIRE_EQUAL(reader.category(), url::token::category::path);
    BOOST_REQUIRE_EQUAL(reader.code(), url::token::code::path_segment);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::path_segment);
    BOOST_REQUIRE_EQUAL(reader.literal(), "two");
    BOOST_REQUIRE_EQUAL(reader.next(), false);
}